

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifc_struct_defs.c
# Opt level: O3

uint16_t ll_net_info_serialize(llabs_network_info_t *net_info,uint8_t *buff)

{
  uint uVar1;
  ulong uVar2;
  uint8_t *buff_cpy;
  
  uVar1 = net_info->network_id_node;
  *(uint *)buff = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar1 = net_info->network_id_gw;
  *(uint *)(buff + 4) =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  buff[8] = net_info->gateway_channel;
  uVar1 = net_info->gateway_frequency;
  *(uint *)(buff + 9) =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  uVar1 = net_info->last_rx_tick;
  *(uint *)(buff + 0xd) =
       uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  *(ushort *)(buff + 0x11) = net_info->rssi << 8 | (ushort)net_info->rssi >> 8;
  buff[0x13] = net_info->snr;
  buff[0x14] = (char)net_info->connection_status;
  buff[0x15] = net_info->is_scanning_gateways;
  uVar2 = net_info->gateway_id;
  *(ulong *)(buff + 0x16) =
       uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
       (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
       (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
  buff[0x1e] = net_info->is_repeater;
  return 0x1f;
}

Assistant:

uint16_t ll_net_info_serialize(const llabs_network_info_t *net_info, uint8_t buff[NET_INFO_BUFF_SIZE])
{
    uint8_t * buff_cpy = buff;
    write_uint32(net_info->network_id_node, &buff_cpy);
    write_uint32(net_info->network_id_gw, &buff_cpy);
    write_uint8(net_info->gateway_channel, &buff_cpy);
    write_uint32(net_info->gateway_frequency, &buff_cpy);
    write_uint32(net_info->last_rx_tick, &buff_cpy);
    write_uint16(net_info->rssi, &buff_cpy);
    write_uint8(net_info->snr, &buff_cpy);
    write_uint8(net_info->connection_status, &buff_cpy);
    write_uint8(net_info->is_scanning_gateways, &buff_cpy);
    write_uint64(net_info->gateway_id, &buff_cpy);
    write_uint8(net_info->is_repeater, &buff_cpy);
    return buff_cpy - buff;
}